

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::LetDeclarationSyntax::getChild(LetDeclarationSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  Token token_02;
  undefined8 in_RDX;
  long in_RSI;
  ConstTokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffff78;
  Info *in_stack_ffffffffffffff80;
  nullptr_t in_stack_ffffffffffffff88;
  
  switch(in_RDX) {
  case 0:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)(in_RSI + 0x18),in_stack_ffffffffffffff78);
    break;
  case 1:
    token.info = in_stack_ffffffffffffff80;
    token._0_8_ = in_stack_ffffffffffffff78;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x9bd81c,token);
    break;
  case 2:
    token_00.info = in_stack_ffffffffffffff80;
    token_00._0_8_ = in_stack_ffffffffffffff78;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x9bd84c,token_00);
    break;
  case 3:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    break;
  case 4:
    token_01.info = in_stack_ffffffffffffff80;
    token_01._0_8_ = in_stack_ffffffffffffff78;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x9bd897,token_01);
    break;
  case 5:
    not_null<slang::syntax::ExpressionSyntax_*>::get
              ((not_null<slang::syntax::ExpressionSyntax_*> *)(in_RSI + 0x88));
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    break;
  case 6:
    token_02.info = in_stack_ffffffffffffff80;
    token_02._0_8_ = in_stack_ffffffffffffff78;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x9bd8ea,token_02);
    break;
  default:
    ConstTokenOrSyntax::ConstTokenOrSyntax(in_RDI,in_stack_ffffffffffffff88);
  }
  return in_RDI;
}

Assistant:

ConstTokenOrSyntax LetDeclarationSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return &attributes;
        case 1: return let;
        case 2: return identifier;
        case 3: return portList;
        case 4: return equals;
        case 5: return expr.get();
        case 6: return semi;
        default: return nullptr;
    }
}